

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAProtocol.h
# Opt level: O0

int AnalyzeSentenceNMEA(char *buf,int buflen,char *talkerid,char *mnemonic,int *psentencelen,
                       int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  int iVar1;
  int local_60;
  char local_58;
  char local_57;
  char local_56;
  int local_54;
  char checksum [4];
  int nb_bytes_end;
  int nb_bytes_mnemonic;
  int nb_bytes_talkerid;
  int i;
  int offset;
  int *pnbBytesToRequest_local;
  int *psentencelen_local;
  char *mnemonic_local;
  char *talkerid_local;
  int buflen_local;
  char *buf_local;
  
  checksum[0] = '\0';
  checksum[1] = '\0';
  checksum[2] = '\0';
  checksum[3] = '\0';
  local_54 = 1;
  *psentencelen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 3) {
    *pnbBytesToRequest = 3 - buflen;
    buf_local._4_4_ = 6;
  }
  else if (((*buf == '$') || (*buf == '!')) || (*buf == ':')) {
    memset(talkerid,0,3);
    memset(mnemonic,0,6);
    nb_bytes_mnemonic = 1;
    while( true ) {
      local_60 = buflen;
      if (8 < buflen) {
        local_60 = 9;
      }
      if (((local_60 <= nb_bytes_mnemonic) || (buf[nb_bytes_mnemonic] == ',')) ||
         ((buf[nb_bytes_mnemonic] == '*' ||
          ((buf[nb_bytes_mnemonic] == '\r' || (buf[nb_bytes_mnemonic] == '\n')))))) break;
      nb_bytes_mnemonic = nb_bytes_mnemonic + 1;
    }
    if (nb_bytes_mnemonic == buflen) {
      *pnbBytesToRequest = local_54;
      buf_local._4_4_ = 6;
    }
    else {
      if (nb_bytes_mnemonic < 6) {
        if (nb_bytes_mnemonic == 5) {
          nb_bytes_end = 1;
        }
        else {
          if (nb_bytes_mnemonic != 3) {
            *pnbBytesToDiscard = 1;
            return 1;
          }
          nb_bytes_end = 2;
        }
      }
      else {
        nb_bytes_end = 2;
      }
      checksum = (char  [4])((nb_bytes_mnemonic - nb_bytes_end) + -1);
      nb_bytes_talkerid = 1;
      for (nb_bytes_mnemonic = 0; nb_bytes_mnemonic < nb_bytes_end;
          nb_bytes_mnemonic = nb_bytes_mnemonic + 1) {
        talkerid[nb_bytes_mnemonic] = buf[nb_bytes_talkerid];
        nb_bytes_talkerid = nb_bytes_talkerid + 1;
      }
      for (nb_bytes_mnemonic = 0; nb_bytes_mnemonic < (int)checksum;
          nb_bytes_mnemonic = nb_bytes_mnemonic + 1) {
        mnemonic[nb_bytes_mnemonic] = buf[nb_bytes_talkerid];
        nb_bytes_talkerid = nb_bytes_talkerid + 1;
      }
      for (; ((nb_bytes_talkerid < buflen && (buf[nb_bytes_talkerid] != '\r')) &&
             (buf[nb_bytes_talkerid] != '\n')); nb_bytes_talkerid = nb_bytes_talkerid + 1) {
      }
      if (nb_bytes_talkerid < buflen) {
        iVar1 = nb_bytes_talkerid + 1;
        if (iVar1 < buflen) {
          if ((buf[iVar1] == '\n') || (buf[iVar1] == '\r')) {
            *psentencelen = nb_bytes_talkerid + 2;
            local_54 = 2;
          }
          else {
            *psentencelen = iVar1;
          }
        }
        else {
          *psentencelen = iVar1;
        }
        if (buf[(*psentencelen + -3) - local_54] == '*') {
          ComputeChecksumNMEA(buf,*psentencelen,&local_58);
          iVar1 = toupper((int)buf[(*psentencelen + -2) - local_54]);
          if ((iVar1 != local_57) ||
             (iVar1 = toupper((int)buf[(*psentencelen + -1) - local_54]), iVar1 != local_56)) {
            *pnbBytesToDiscard = 1;
            return 1;
          }
        }
        buf_local._4_4_ = 0;
      }
      else {
        *pnbBytesToRequest = local_54;
        buf_local._4_4_ = 6;
      }
    }
  }
  else {
    *pnbBytesToDiscard = 1;
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzeSentenceNMEA(char* buf, int buflen, char* talkerid, char* mnemonic, int* psentencelen, 
								   int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	int offset = 0, i = 0, nb_bytes_talkerid = MIN_NB_BYTES_TALKER_ID_NMEA, nb_bytes_mnemonic = MIN_NB_BYTES_MNEMONIC_NMEA, nb_bytes_end = MIN_NB_BYTES_END_NMEA;
	char checksum[MAX_NB_BYTES_CHECKSUM_NMEA+1]; // +1 for the null terminator character for strings.

	*psentencelen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_NB_BYTES_SENTENCE_NMEA)
	{
		*pnbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (((buf[0] != '$')&&(buf[0] != '!')&&(buf[0] != ':')))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the start character can be discarded...
		return EXIT_FAILURE;
	}

	memset(talkerid, 0, MAX_NB_BYTES_TALKER_ID_NMEA+1); // +1 for the null terminator character for strings.
	memset(mnemonic, 0, MAX_NB_BYTES_MNEMONIC_NMEA+1); // +1 for the null terminator character for strings.
	// Start at i = 1 because of the start character...
	for (i = 1; i < min(buflen, 1+MAX_NB_BYTES_ADDRESS_NMEA+1); i++)
	{
		if ((buf[i] == ',')||(buf[i] == '*')||(buf[i] == '\r')||(buf[i] == '\n')) break;
	}
	if (i == buflen)
	{
		*pnbBytesToRequest = nb_bytes_end;
		return EXIT_OUT_OF_MEMORY;
	}
	else if (i >= DEFAULT_NB_BYTES_TALKER_ID_NMEA+DEFAULT_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = DEFAULT_NB_BYTES_TALKER_ID_NMEA;
	}
	else if (i == MIN_NB_BYTES_TALKER_ID_NMEA+DEFAULT_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = MIN_NB_BYTES_TALKER_ID_NMEA;
	}
	else if (i == DEFAULT_NB_BYTES_TALKER_ID_NMEA+MIN_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = DEFAULT_NB_BYTES_TALKER_ID_NMEA;
	}
	else
	{
		*pnbBytesToDiscard = 1; // We are only sure that the start character can be discarded...
		return EXIT_FAILURE;
	}

	nb_bytes_mnemonic = i-nb_bytes_talkerid-1;
	
	offset = 1;
	for (i = 0; i < nb_bytes_talkerid; i++)
	{
		talkerid[i] = buf[offset];
		offset++;
	}
	for (i = 0; i < nb_bytes_mnemonic; i++)
	{
		mnemonic[i] = buf[offset];
		offset++;
	}

	// Line endings problems...

	while (offset < buflen)
	{
		if ((buf[offset] == '\r')||(buf[offset] == '\n')) break;
		offset++;
	}
	if (offset >= buflen)
	{
		*pnbBytesToRequest = nb_bytes_end;
		return EXIT_OUT_OF_MEMORY;
	}
	offset++;
	if (offset < buflen)
	{
		if ((buf[offset] != '\n')&&(buf[offset] != '\r'))
		{
			*psentencelen = offset;
		}
		else 
		{
			*psentencelen = offset+1;
			nb_bytes_end = MAX_NB_BYTES_END_NMEA;
		}
	}
	else
	{
		*psentencelen = offset;
	}

	// If there is a checksum, check it.
	if (buf[*psentencelen-MAX_NB_BYTES_CHECKSUM_NMEA-nb_bytes_end] == '*')
	{
		ComputeChecksumNMEA(buf, *psentencelen, checksum);
		if ((toupper(buf[*psentencelen-2-nb_bytes_end]) != checksum[1])||(toupper(buf[*psentencelen-1-nb_bytes_end]) != checksum[2]))
		{ 
			PRINT_DEBUG_MESSAGE_OSUTILS(("Warning : NMEA checksum error (computed \"%.3s\", found \"*%c%c\"). \n", checksum, buf[*psentencelen-2-nb_bytes_end], buf[*psentencelen-1-nb_bytes_end]));
			//for (i = 0; i < buflen; i++) printf("%c", buf[i]);
			//printf("\n");
			//for (i = 0; i < buflen; i++) printf("0x%02x ", (unsigned)buf[i]);			
			//printf("\n");
			//*pnbBytesToDiscard = *psentencelen;
			*pnbBytesToDiscard = 1; // Not sure more than the start character can be discarded...
			return EXIT_FAILURE;	
		}
	}

	return EXIT_SUCCESS;
}